

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O2

void __thiscall
Js::StringProfiler::RecordConcatenation
          (StringProfiler *this,uint lenLeft,uint lenRight,ConcatType type)

{
  bool bVar1;
  ConcatMetrics local_48;
  UintUintPair local_38;
  UintUintPair key;
  ConcatMetrics *metrics;
  
  bVar1 = IsOnWrongThread(this);
  if (!bVar1) {
    local_38.first = lenLeft;
    if (0x13 < lenLeft) {
      local_38.first = 0x14;
    }
    local_38.second = 0x14;
    if (lenRight < 0x14) {
      local_38.second = lenRight;
    }
    bVar1 = JsUtil::
            BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<Js::StringProfiler::UintUintPair>
                      (&this->stringConcatMetrics,&local_38,(ConcatMetrics **)&key);
    if (bVar1) {
      ConcatMetrics::Accumulate((ConcatMetrics *)key,type);
    }
    else {
      ConcatMetrics::ConcatMetrics(&local_48,type);
      JsUtil::
      BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&this->stringConcatMetrics,&local_38,&local_48);
    }
  }
  return;
}

Assistant:

void StringProfiler::RecordConcatenation( uint lenLeft, uint lenRight, ConcatType type )
    {
        if( IsOnWrongThread() )
        {
            return;
        }

        lenLeft = min( lenLeft, k_MaxConcatLength );
        lenRight = min( lenRight, k_MaxConcatLength );

        UintUintPair key = { lenLeft, lenRight };
        ConcatMetrics* metrics;
        if(!stringConcatMetrics.TryGetReference(key, &metrics))
        {
            stringConcatMetrics.Add(key, ConcatMetrics(type));
        }
        else
        {
            metrics->Accumulate(type);
        }
    }